

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O2

double __thiscall ON_Sun::CImpl::Azimuth(CImpl *this)

{
  bool bVar1;
  double dVar2;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  bVar1 = ManualControlOn(this);
  if (bVar1) {
    ::ON_XMLVariant::ON_XMLVariant(&local_108,0.0);
    ON_InternalXMLImpl::GetParameter
              (&local_200,&this->super_ON_InternalXMLImpl,
               L"render-content-manager-document/settings/sun",L"sun-azimuth",&local_108);
    dVar2 = ::ON_XMLVariant::AsDouble(&local_200);
    ::ON_XMLVariant::~ON_XMLVariant(&local_200);
    ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  }
  else {
    UpdateAziAlt(this);
    dVar2 = this->_azimuth;
  }
  return dVar2;
}

Assistant:

double ON_Sun::CImpl::Azimuth(void) const
{
  if (IsUsingManualControl())
    return GetParameter(XMLPath_Sun(), ON_RDK_SUN_AZIMUTH, 0.0).AsDouble();

  UpdateAziAlt();

  return _azimuth;
}